

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

Expr * __thiscall
SQCompilation::CheckerVisitor::maybeEval
          (CheckerVisitor *this,Expr *e,int32_t *evalId,
          unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
          *visited,bool allow_external)

{
  byte bVar1;
  bool bVar2;
  TreeOp TVar3;
  iterator iVar4;
  ValueRef *this_00;
  int32_t *in_RCX;
  Expr *in_RDX;
  CheckerVisitor *in_RSI;
  byte in_R8B;
  ValueRef *v;
  unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
  *in_stack_ffffffffffffff98;
  Expr **in_stack_ffffffffffffffa8;
  unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
  *in_stack_ffffffffffffffb0;
  _Node_iterator_base<const_SQCompilation::Expr_*,_false> local_40;
  undefined1 allow_external_00;
  undefined7 in_stack_ffffffffffffffd0;
  CheckerVisitor *local_8;
  
  bVar1 = in_R8B & 1;
  iVar4 = std::
          unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
          ::find(in_stack_ffffffffffffff98,(key_type *)0x19653a);
  allow_external_00 =
       iVar4.super__Node_iterator_base<const_SQCompilation::Expr_*,_false>._M_cur._7_1_;
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
       ::end(in_stack_ffffffffffffff98);
  bVar2 = std::__detail::operator!=
                    ((_Node_iterator_base<const_SQCompilation::Expr_*,_false> *)
                     &stack0xffffffffffffffc8,&local_40);
  local_8 = in_RSI;
  if (!bVar2) {
    std::
    unordered_set<SQCompilation::Expr_const*,std::hash<SQCompilation::Expr_const*>,std::equal_to<SQCompilation::Expr_const*>,std::allocator<SQCompilation::Expr_const*>>
    ::emplace<SQCompilation::Expr_const*&>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_8 = (CheckerVisitor *)deparen((Expr *)in_stack_ffffffffffffff98);
    this_00 = findValueForExpr((CheckerVisitor *)evalId,(Expr *)visited);
    if (this_00 != (ValueRef *)0x0) {
      *(int32_t *)&(in_RDX->super_Node).super_ArenaObj._vptr_ArenaObj = this_00->evalIndex;
      bVar2 = ValueRef::hasValue(this_00);
      if ((bVar2) &&
         ((((bVar1 & 1) != 0 || (this_00->expression == (Expr *)0x0)) ||
          (TVar3 = Node::op(&this_00->expression->super_Node), TVar3 != TO_EXTERNAL_VALUE)))) {
        local_8 = (CheckerVisitor *)
                  maybeEval(local_8,in_RDX,in_RCX,
                            (unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
                             *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),(bool)allow_external_00);
      }
    }
  }
  return (Expr *)local_8;
}

Assistant:

const Expr *CheckerVisitor::maybeEval(const Expr *e, int32_t &evalId, std::unordered_set<const Expr *> &visited, bool allow_external) {

  if (visited.find(e) != visited.end())
    return e;

  visited.emplace(e);

  e = deparen(e);
  const ValueRef *v = findValueForExpr(e);

  if (!v) {
    return e;
  }

  evalId = v->evalIndex;
  if (v->hasValue()) {
    if (!allow_external && v->expression && v->expression->op() == TO_EXTERNAL_VALUE)
      return e;
    return maybeEval(v->expression, evalId, visited, allow_external);
  }
  else {
    return e;
  }
}